

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ForInObjectEnumerator.cpp
# Opt level: O3

void __thiscall
Js::ForInObjectEnumerator::ShadowData::ShadowData
          (ShadowData *this,RecyclableObject *initObject,RecyclableObject *firstPrototype,
          Recycler *recycler)

{
  Type *addr;
  Type *addr_00;
  
  Memory::Recycler::WBSetBit((char *)this);
  (this->currentObject).ptr = initObject;
  Memory::RecyclerWriteBarrierManager::WriteBarrier(this);
  Memory::Recycler::WBSetBit((char *)&this->firstPrototype);
  (this->firstPrototype).ptr = firstPrototype;
  Memory::RecyclerWriteBarrierManager::WriteBarrier(&this->firstPrototype);
  (this->propertyIds).head.ptr = (BVSparseNode<Memory::Recycler> *)0x0;
  (this->propertyIds).lastFoundIndex.ptr = (BVSparseNode<Memory::Recycler> *)0x0;
  (this->propertyIds).alloc = recycler;
  addr = &(this->propertyIds).lastUsedNodePrevNextField;
  (this->propertyIds).lastUsedNodePrevNextField.ptr =
       (WriteBarrierPtr<BVSparseNode<Memory::Recycler>_> *)0x0;
  Memory::Recycler::WBSetBit((char *)addr);
  (this->propertyIds).lastUsedNodePrevNextField.ptr = &(this->propertyIds).head;
  Memory::RecyclerWriteBarrierManager::WriteBarrier(addr);
  addr_00 = &this->newPropertyStrings;
  (this->newPropertyStrings).super_SListNodeBase<Memory::Recycler>.next.ptr =
       (SListNodeBase<Memory::Recycler> *)0x0;
  (this->newPropertyStrings).super_RealCount.count = 0;
  Memory::Recycler::WBSetBit((char *)addr_00);
  (addr_00->super_SListNodeBase<Memory::Recycler>).next.ptr =
       &addr_00->super_SListNodeBase<Memory::Recycler>;
  Memory::RecyclerWriteBarrierManager::WriteBarrier(addr_00);
  (this->newPropertyStrings).super_RealCount.count = 0;
  return;
}

Assistant:

ForInObjectEnumerator::ShadowData::ShadowData(
        RecyclableObject * initObject,
        RecyclableObject * firstPrototype,
        Recycler * recycler)
        : currentObject(initObject),
          firstPrototype(firstPrototype),
          propertyIds(recycler)
    {
    }